

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::TiledInputFile::rawTileData
          (TiledInputFile *this,int *dx,int *dy,int *lx,int *ly,char **pixelData,int *pixelDataSize)

{
  int dx_00;
  int dy_00;
  int lx_00;
  int ly_00;
  int lx_01;
  int ly_01;
  int dx_01;
  int dy_01;
  IStream *pIVar1;
  bool bVar2;
  Int64 *pIVar3;
  ArgExc *pAVar4;
  code *pcVar5;
  undefined *puVar6;
  char *pcVar7;
  Data *pDVar8;
  InputStreamMutex *pIVar9;
  int local_1d4;
  TileBuffer *local_1d0;
  int *local_1c8;
  char **local_1c0;
  stringstream _iex_replace_s;
  
  __iex_replace_s = this->_data->_streamData;
  std::mutex::lock(&__iex_replace_s->super_Mutex);
  dx_00 = *dx;
  dy_00 = *dy;
  lx_00 = *lx;
  ly_00 = *ly;
  local_1c8 = dy;
  local_1c0 = pixelData;
  bVar2 = isValidTile(this,dx_00,dy_00,lx_00,ly_00);
  if (!bVar2) {
    pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar4,"Tried to read a tile outside the image file\'s data window.");
    __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  pDVar8 = this->_data;
  pIVar9 = pDVar8->_streamData;
  local_1d0 = *(pDVar8->tileBuffers).
               super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  if ((pDVar8->version & 0x1000) == 0) {
LAB_0013cf82:
    Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(pIVar9->is,dx);
    Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(pIVar9->is,local_1c8);
    Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(pIVar9->is,lx);
    Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(pIVar9->is,ly);
    Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(pIVar9->is,pixelDataSize);
    if (*pixelDataSize <= (int)pDVar8->tileBufferSize) {
      (*pIVar9->is->_vptr_IStream[3])(pIVar9->is,local_1d0->buffer);
      pIVar9->currentPosition = (long)*pixelDataSize + pIVar9->currentPosition + 0x14;
      lx_01 = *lx;
      ly_01 = *ly;
      bVar2 = isValidLevel(this,lx_01,ly_01);
      if (bVar2) {
        dx_01 = *dx;
        dy_01 = *local_1c8;
        bVar2 = isValidTile(this,dx_01,dy_01,lx_01,ly_01);
        if (!bVar2) goto LAB_0013d09f;
        if (((this->_data->version & 0x1000) == 0) ||
           ((((ly_00 == ly_01 && (lx_00 == lx_01)) && (dx_00 == dx_01)) && (dy_00 == dy_01)))) {
          *local_1c0 = local_1d0->buffer;
          IlmThread_2_5::Lock::~Lock((Lock *)&_iex_replace_s);
          return;
        }
        pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
        pcVar7 = "rawTileData read the wrong tile";
      }
      else {
LAB_0013d09f:
        pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
        pcVar7 = "File contains an invalid tile";
      }
      Iex_2_5::ArgExc::ArgExc(pAVar4,pcVar7);
      pcVar5 = Iex_2_5::ArgExc::~ArgExc;
      puVar6 = &Iex_2_5::ArgExc::typeinfo;
      goto LAB_0013d151;
    }
    pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
    pcVar7 = "Unexpected tile block length.";
  }
  else {
    pIVar1 = pIVar9->is;
    pIVar3 = TileOffsets::operator()(&pDVar8->tileOffsets,dx_00,dy_00,lx_00,ly_00);
    (*pIVar1->_vptr_IStream[6])(pIVar1,*pIVar3);
    pDVar8 = this->_data;
    pIVar9 = pDVar8->_streamData;
    if ((pDVar8->version & 0x1000) == 0) goto LAB_0013cf82;
    (*pIVar9->is->_vptr_IStream[3])(pIVar9->is,&local_1d4,4);
    if (local_1d4 == pDVar8->partNumber) goto LAB_0013cf82;
    pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
    pcVar7 = "Unexpected part number in readNextTileData";
  }
  Iex_2_5::InputExc::InputExc((InputExc *)pAVar4,pcVar7);
  pcVar5 = Iex_2_5::InputExc::~InputExc;
  puVar6 = &Iex_2_5::InputExc::typeinfo;
LAB_0013d151:
  __cxa_throw(pAVar4,puVar6,pcVar5);
}

Assistant:

void
TiledInputFile::rawTileData (int &dx, int &dy,
			     int &lx, int &ly,
                             const char *&pixelData,
			     int &pixelDataSize)
{
    try
    {
        Lock lock (*_data->_streamData);

        if (!isValidTile (dx, dy, lx, ly))
            throw IEX_NAMESPACE::ArgExc ("Tried to read a tile outside "
			       "the image file's data window.");

        TileBuffer *tileBuffer = _data->getTileBuffer (0);

        //
        // if file is a multipart file, we have to seek to the required tile
        // since we don't know where the file pointer is
        //
        int old_dx=dx;
        int old_dy=dy;
        int old_lx=lx;
        int old_ly=ly;
        if(isMultiPart(version()))
        {
            _data->_streamData->is->seekg(_data->tileOffsets(dx,dy,lx,ly));
        }
        readNextTileData (_data->_streamData, _data, dx, dy, lx, ly,
			  tileBuffer->buffer,
                          pixelDataSize);

        if ( !isValidLevel(lx,ly) || !isValidTile (dx, dy, lx, ly) )
            throw IEX_NAMESPACE::ArgExc ("File contains an invalid tile");


        if(isMultiPart(version()))
        {
            if (old_dx!=dx || old_dy !=dy || old_lx!=lx || old_ly!=ly)
            {
                throw IEX_NAMESPACE::ArgExc ("rawTileData read the wrong tile");
            }
        }
        else
        {
             if(!isValidTile (dx, dy, lx, ly) )
             {
                 throw IEX_NAMESPACE::IoExc ("rawTileData read an invalid tile");
             }
        }
        pixelData = tileBuffer->buffer;
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        REPLACE_EXC (e, "Error reading pixel data from image "
                     "file \"" << fileName() << "\". " << e.what());
        throw;
    }
}